

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
imrt::IntensityILS::getShuffledCells(IntensityILS *this,Station *s)

{
  pointer ppVar1;
  int iVar2;
  int iVar3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  iterator __first;
  iterator __last;
  long in_RDX;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RDI;
  int j;
  int i;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *cells;
  pair<int,_int> in_stack_ffffffffffffff88;
  int local_30;
  int local_20;
  
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1610aa);
  local_20 = 0;
  while (iVar3 = local_20, iVar2 = maths::Matrix::nb_rows((Matrix *)(in_RDX + 0xb8)), iVar3 < iVar2)
  {
    for (local_30 = 0; iVar3 = maths::Matrix::nb_cols((Matrix *)(in_RDX + 0xb8)), local_30 < iVar3;
        local_30 = local_30 + 1) {
      this_00 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                maths::Matrix::operator()((Matrix *)(in_RDX + 0xb8),local_20,local_30);
      ppVar1 = (this_00->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (((double)ppVar1 != -1.0) || (NAN((double)ppVar1))) {
        in_stack_ffffffffffffff88 =
             std::make_pair<int&,int&>((int *)in_stack_ffffffffffffff88,(int *)0x161162);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (this_00,(value_type *)in_stack_ffffffffffffff88);
      }
    }
    local_20 = local_20 + 1;
  }
  __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       in_stack_ffffffffffffff88);
  __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      in_stack_ffffffffffffff88);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,int(&)(int)>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__last._M_current,(_func_int_int *)in_RDI);
  return in_RDI;
}

Assistant:

vector < pair<int, int> > IntensityILS::getShuffledCells(Station* s){
		 vector < pair<int, int> > cells;
		 for (int i=0; i<s->I.nb_rows();i++)
			 for (int j=0; j<s->I.nb_cols(); j++)
				 if(s->I(i,j)!=-1) cells.push_back(make_pair(i,j));
		 std::random_shuffle ( cells.begin(), cells.end(), myrandom);
		 return cells;
	 }